

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O1

bool tinyjson::atod(char *s,char *s_end,double *result)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  
  if (s_end <= s) {
    return false;
  }
  cVar5 = *s;
  if ((cVar5 == '-') || (cVar5 == '+')) {
    s = s + 1;
    if (s == s_end) {
      bVar12 = false;
    }
    else {
      bVar12 = *s == 0x2e;
    }
LAB_00102a7e:
    bVar13 = s != s_end;
    dVar15 = 0.0;
    dVar14 = 0.0;
    if (!bVar12) {
      if (s == s_end) {
        bVar12 = true;
      }
      else {
        uVar3 = (int)*s - 0x30;
        bVar12 = 9 < uVar3;
        dVar15 = 0.0;
        if (!bVar12) {
          do {
            pbVar9 = (byte *)s + 1;
            dVar14 = (double)(int)uVar3 + dVar14 * 10.0;
            s = s_end;
            if (pbVar9 == (byte *)s_end) break;
            uVar3 = (int)(char)*pbVar9 - 0x30;
            s = (char *)pbVar9;
          } while (uVar3 < 10);
          bVar13 = pbVar9 != (byte *)s_end;
          dVar15 = dVar14;
        }
      }
      if (bVar12) goto LAB_00102af3;
    }
    iVar6 = 0;
    iVar7 = 0;
    if (bVar13) {
      bVar1 = *s;
      pbVar9 = (byte *)s;
      iVar7 = iVar6;
      if ((bVar1 != 0x65) && (bVar1 != 0x45)) {
        if (bVar1 != 0x2e) goto LAB_00102c79;
        pbVar9 = (byte *)s + 1;
        bVar13 = pbVar9 != (byte *)s_end;
        if ((bVar13) && (uVar3 = (int)(char)((byte *)s)[1] - 0x30, uVar3 < 10)) {
          uVar8 = 1;
          iVar6 = -1;
          pbVar11 = (byte *)s + 2;
          do {
            pbVar10 = pbVar11;
            if (uVar8 < 8) {
              dVar14 = atod::pow_lut[uVar8];
            }
            else {
              dVar14 = pow(10.0,(double)iVar6);
            }
            dVar15 = dVar15 + (double)(int)uVar3 * dVar14;
            bVar13 = pbVar10 != (byte *)s_end;
            pbVar9 = (byte *)s_end;
            if (pbVar10 == (byte *)s_end) break;
            uVar8 = uVar8 + 1;
            uVar3 = (int)(char)*pbVar10 - 0x30;
            iVar6 = iVar6 + -1;
            pbVar11 = pbVar10 + 1;
            pbVar9 = pbVar10;
          } while (uVar3 < 10);
        }
      }
      if ((bVar13) && ((*pbVar9 | 0x20) == 0x65)) {
        pbVar11 = pbVar9 + 1;
        if ((pbVar11 == (byte *)s_end) || ((bVar1 = *pbVar11, bVar1 != 0x2d && (bVar1 != 0x2b)))) {
          iVar6 = 1;
          if (9 < (int)(char)*pbVar11 - 0x30U) goto LAB_00102af3;
        }
        else {
          pbVar11 = pbVar9 + 2;
          iVar6 = (uint)(bVar1 == 0x2b) * 2 + -1;
        }
        if (pbVar11 == (byte *)s_end) {
          bVar12 = true;
          iVar7 = 0;
        }
        else {
          lVar4 = 0;
          iVar7 = 0;
          do {
            if (9 < (int)(char)pbVar11[lVar4] - 0x30U) goto LAB_00102c61;
            iVar7 = ((int)(char)pbVar11[lVar4] - 0x30U) + iVar7 * 10;
            lVar2 = lVar4 + 1;
            lVar4 = lVar4 + 1;
          } while (pbVar11 + lVar2 != (byte *)s_end);
          lVar4 = 1;
LAB_00102c61:
          bVar12 = (int)lVar4 == 0;
        }
        if (bVar12) goto LAB_00102af3;
        iVar7 = iVar7 * iVar6;
      }
    }
LAB_00102c79:
    if (iVar7 != 0) {
      dVar14 = pow(5.0,(double)iVar7);
      dVar15 = ldexp(dVar14 * dVar15,iVar7);
    }
    if (cVar5 != '+') {
      dVar15 = -dVar15;
    }
    *result = dVar15;
    bVar12 = true;
  }
  else {
    if ((int)cVar5 - 0x30U < 10) {
      bVar12 = false;
      cVar5 = '+';
      goto LAB_00102a7e;
    }
    bVar12 = true;
    bVar13 = cVar5 == '.';
    cVar5 = '+';
    if (bVar13) goto LAB_00102a7e;
LAB_00102af3:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

static bool atod(const char *s, const char *s_end, double *result) {
    if (s >= s_end) {
      return false;
    }

    double mantissa = 0.0;
    // This exponent is base 2 rather than 10.
    // However the exponent we parse is supposed to be one of ten,
    // thus we must take care to convert the exponent/and or the
    // mantissa to a * 2^E, where a is the mantissa and E is the
    // exponent.
    // To get the final double we will use ldexp, it requires the
    // exponent to be in base 2.
    int exponent = 0;

    // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
    // TO JUMP OVER DEFINITIONS.
    char sign = '+';
    char exp_sign = '+';
    char const *curr = s;

    // How many characters were read in a loop.
    int read = 0;
    // Tells whether a loop terminated due to reaching s_end.
    bool end_not_reached = false;
    bool leading_decimal_dots = false;

    /*
            BEGIN PARSING.
    */

    // Find out what sign we've got.
    if (*curr == '+' || *curr == '-') {
      sign = *curr;
      curr++;
      if ((curr != s_end) && (*curr == '.')) {
        // accept. Somethig like `.7e+2`, `-.5234`
        leading_decimal_dots = true;
      }
    } else if (is_digit(*curr)) { /* Pass through. */
    } else if (*curr == '.') {
      // accept. Somethig like `.7e+2`, `-.5234`
      leading_decimal_dots = true;
    } else {
      goto fail;
    }

    // Read the integer part.
    end_not_reached = (curr != s_end);
    if (!leading_decimal_dots) {
      while (end_not_reached && is_digit(*curr)) {
        mantissa *= 10;
        mantissa += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }

      // We must make sure we actually got something.
      if (read == 0) goto fail;
    }

    // We allow numbers of form "#", "###" etc.
    if (!end_not_reached) goto assemble;

    // Read the decimal part.
    if (*curr == '.') {
      curr++;
      read = 1;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        static const double pow_lut[] = {
                1.0, 0.1, 0.01, 0.001, 0.0001, 0.00001, 0.000001, 0.0000001,
        };
        const int lut_entries = sizeof pow_lut / sizeof pow_lut[0];

        // NOTE: Don't use powf here, it will absolutely murder precision.
        mantissa += static_cast<int>(*curr - 0x30) *
                    (read < lut_entries ? pow_lut[read] : std::pow(10.0, -read));
        read++;
        curr++;
        end_not_reached = (curr != s_end);
      }
    } else if (*curr == 'e' || *curr == 'E') {
    } else {
      goto assemble;
    }

    if (!end_not_reached) goto assemble;

    // Read the exponent part.
    if (*curr == 'e' || *curr == 'E') {
      curr++;
      // Figure out if a sign is present and if it is.
      end_not_reached = (curr != s_end);
      if (end_not_reached && (*curr == '+' || *curr == '-')) {
        exp_sign = *curr;
        curr++;
      } else if (is_digit(*curr)) { /* Pass through. */
      } else {
        // Empty E is not allowed.
        goto fail;
      }

      read = 0;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        exponent *= 10;
        exponent += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }
      exponent *= (exp_sign == '+' ? 1 : -1);
      if (read == 0) goto fail;
    }

    assemble:
    *result = (sign == '+' ? 1 : -1) *
              (exponent ? std::ldexp(mantissa * std::pow(5.0, exponent), exponent)
                        : mantissa);
    return true;
    fail:
    return false;
  }